

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O2

bool __thiscall hittable_list::hit(hittable_list *this,ray *r,interval ray_t,hit_record *rec)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<hittable> *object;
  pointer psVar5;
  hit_record temp_rec;
  double local_a8;
  hit_record local_98;
  
  local_a8 = ray_t.max;
  local_98.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_98.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.normal.e[1] = 0.0;
  local_98.normal.e[2] = 0.0;
  local_98.p.e[2] = 0.0;
  local_98.normal.e[0] = 0.0;
  local_98.p.e[0] = 0.0;
  local_98.p.e[1] = 0.0;
  psVar1 = (this->objects).
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  for (psVar5 = (this->objects).
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    peVar2 = (psVar5->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*peVar2->_vptr_hittable[2])(ray_t.min._0_4_,local_a8,peVar2,r,&local_98);
    if ((char)iVar3 != '\0') {
      local_a8 = local_98.t;
      hit_record::operator=(rec,&local_98);
      bVar4 = true;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.mat.super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar4;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        hit_record temp_rec;
        bool hit_anything = false;
        auto closest_so_far = ray_t.max;

        for (const auto& object : objects) {
            if (object->hit(r, interval(ray_t.min, closest_so_far), temp_rec)) {
                hit_anything = true;
                closest_so_far = temp_rec.t;
                rec = temp_rec;
            }
        }

        return hit_anything;
    }